

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall AGSSock::AGSSocket::Unserialize(AGSSocket *this,int key,char *buffer,int length)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  size_t __n;
  AGSSocketSerial serial;
  string tag;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar3 = (ulong)length;
  __n = 0x18;
  if (uVar3 < 0x18) {
    __n = uVar3;
  }
  memcpy(&serial,buffer,__n);
  tag._M_dataplus._M_p = (pointer)&tag.field_2;
  tag._M_string_length = 0;
  tag.field_2._M_local_buf[0] = '\0';
  if ((int)__n < length) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,buffer + __n,buffer + uVar3);
    std::__cxx11::string::operator=((string *)&tag,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  puVar1 = (undefined4 *)operator_new(0xa0);
  *puVar1 = 0xffffffff;
  puVar1[1] = serial.domain;
  puVar1[2] = serial.type;
  puVar1[3] = serial.protocol;
  puVar1[4] = serial.error;
  uVar2 = (**(code **)(*AGSSockAPI::engine + 0x238))(AGSSockAPI::engine,serial.local);
  *(undefined8 *)(puVar1 + 6) = uVar2;
  uVar2 = (**(code **)(*AGSSockAPI::engine + 0x238))(AGSSockAPI::engine,serial.remote);
  *(undefined8 *)(puVar1 + 8) = uVar2;
  std::__cxx11::string::string((string *)(puVar1 + 10),(string *)&tag);
  Buffer::Buffer((Buffer *)(puVar1 + 0x12));
  (**(code **)(*AGSSockAPI::engine + 0x230))(AGSSockAPI::engine,key,puVar1,&agsSocket);
  std::__cxx11::string::~string((string *)&tag);
  return;
}

Assistant:

void AGSSocket::Unserialize(int key, const char *buffer, int length)
{
	AGSSocketSerial serial;
	int size = MIN(length, sizeof (AGSSocketSerial));
	memcpy(&serial, buffer, size);

	string tag;
	if (length - size > 0)
		tag = string(buffer + size, (size_t) length - size);
	
	Socket *sock = new Socket
	{
		INVALID_SOCKET,
		serial.domain, serial.type, serial.protocol,
		serial.error,
		AGS_FROM_KEY(SockAddr, serial.local),
		AGS_FROM_KEY(SockAddr, serial.remote),
		tag
	};
	
	AGS_RESTORE(Socket, sock, key);
}